

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# events.c
# Opt level: O2

void monitor_callback(GLFWmonitor *monitor,int event)

{
  uint uVar1;
  GLFWvidmode *pGVar2;
  char *pcVar3;
  double dVar4;
  int x;
  int heightMM;
  int widthMM;
  int y;
  
  uVar1 = counter;
  if (event != 0x40002) {
    if (event == 0x40001) {
      pGVar2 = glfwGetVideoMode(monitor);
      glfwGetMonitorPos(monitor,&x,&y);
      glfwGetMonitorPhysicalSize(monitor,&widthMM,&heightMM);
      uVar1 = counter;
      counter = counter + 1;
      dVar4 = glfwGetTime();
      pcVar3 = glfwGetMonitorName(monitor);
      printf("%08x at %0.3f: Monitor %s (%ix%i at %ix%i, %ix%i mm) was connected\n",dVar4,
             (ulong)uVar1,pcVar3,(ulong)(uint)pGVar2->width,(ulong)(uint)pGVar2->height,
             (ulong)(uint)x,(ulong)(uint)y,(ulong)(uint)widthMM,(ulong)(uint)heightMM);
    }
    return;
  }
  counter = counter + 1;
  dVar4 = glfwGetTime();
  pcVar3 = glfwGetMonitorName(monitor);
  printf("%08x at %0.3f: Monitor %s was disconnected\n",dVar4,(ulong)uVar1,pcVar3);
  return;
}

Assistant:

static void monitor_callback(GLFWmonitor* monitor, int event)
{
    if (event == GLFW_CONNECTED)
    {
        int x, y, widthMM, heightMM;
        const GLFWvidmode* mode = glfwGetVideoMode(monitor);

        glfwGetMonitorPos(monitor, &x, &y);
        glfwGetMonitorPhysicalSize(monitor, &widthMM, &heightMM);

        printf("%08x at %0.3f: Monitor %s (%ix%i at %ix%i, %ix%i mm) was connected\n",
               counter++,
               glfwGetTime(),
               glfwGetMonitorName(monitor),
               mode->width, mode->height,
               x, y,
               widthMM, heightMM);
    }
    else if (event == GLFW_DISCONNECTED)
    {
        printf("%08x at %0.3f: Monitor %s was disconnected\n",
               counter++,
               glfwGetTime(),
               glfwGetMonitorName(monitor));
    }
}